

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * wasm::Literal::makeFromMemory(Literal *__return_storage_ptr__,void *p,Type type)

{
  bool bVar1;
  BasicType BVar2;
  float init;
  double init_00;
  int64_t local_58;
  uint8_t bytes [16];
  int64_t local_40;
  int64_t i_3;
  int64_t iStack_30;
  int32_t i_2;
  int64_t i_1;
  int64_t *piStack_20;
  int32_t i;
  void *p_local;
  Type type_local;
  
  piStack_20 = (int64_t *)p;
  p_local = (void *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar1 = wasm::Type::isNumber((Type *)&p_local);
  if (bVar1) {
    BVar2 = wasm::Type::getBasic((Type *)&p_local);
    switch(BVar2) {
    case i32:
      i_1._4_4_ = (int32_t)*piStack_20;
      Literal(__return_storage_ptr__,i_1._4_4_);
      break;
    case i64:
      iStack_30 = *piStack_20;
      Literal(__return_storage_ptr__,iStack_30);
      break;
    case f32:
      i_3._4_4_ = (int32_t)*piStack_20;
      init = bit_cast<float,int>((int *)((long)&i_3 + 4));
      Literal(__return_storage_ptr__,init);
      break;
    case f64:
      local_40 = *piStack_20;
      init_00 = bit_cast<double,long>(&local_40);
      Literal(__return_storage_ptr__,init_00);
      break;
    case v128:
      local_58 = *piStack_20;
      bytes._0_8_ = piStack_20[1];
      Literal(__return_storage_ptr__,(uint8_t *)&local_58);
      break;
    default:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x12f);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.isNumber()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x113,"static Literal wasm::Literal::makeFromMemory(void *, Type)");
}

Assistant:

Literal Literal::makeFromMemory(void* p, Type type) {
  assert(type.isNumber());
  switch (type.getBasic()) {
    case Type::i32: {
      int32_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(i);
    }
    case Type::i64: {
      int64_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(i);
    }
    case Type::f32: {
      int32_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(bit_cast<float>(i));
    }
    case Type::f64: {
      int64_t i;
      memcpy(&i, p, sizeof(i));
      return Literal(bit_cast<double>(i));
    }
    case Type::v128: {
      uint8_t bytes[16];
      memcpy(bytes, p, sizeof(bytes));
      return Literal(bytes);
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}